

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLString.cpp
# Opt level: O0

bool xercesc_4_0::XMLString::isWSReplaced(XMLCh *toCheck)

{
  XMLCh *local_20;
  XMLCh *startPtr;
  XMLCh *toCheck_local;
  
  if ((toCheck != (XMLCh *)0x0) && (local_20 = toCheck, *toCheck != L'\0')) {
    for (; *local_20 != L'\0'; local_20 = local_20 + 1) {
      if (((*local_20 == L'\r') || (*local_20 == L'\n')) || (*local_20 == L'\t')) {
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool XMLString::isWSReplaced(const XMLCh* const toCheck)
{
    // If no string, then its a OK
    if (( !toCheck ) || ( !*toCheck ))
        return true;

    const XMLCh* startPtr = toCheck;
    while ( *startPtr )
    {
        if ( ( *startPtr == chCR) ||
             ( *startPtr == chLF) ||
             ( *startPtr == chHTab))
        return false;

        startPtr++;
    }

    return true;
}